

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::Option_group::Option_group
          (Option_group *this,string *group_description,string *group_name,App *parent)

{
  bool bVar1;
  reference pvVar2;
  string *in_RCX;
  string *in_RDX;
  App *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_fffffffffffffe88;
  App *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  allocator<char> local_109 [40];
  allocator<char> local_e1 [40];
  allocator<char> local_b9 [88];
  allocator<char> local_61 [57];
  App *in_stack_ffffffffffffffd8;
  
  ::std::__cxx11::string::string(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  __a = local_61;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,__a);
  App::App(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  ::std::allocator<char>::~allocator((allocator<char> *)local_61);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  *in_RDI = &PTR__Option_group_009234b8;
  ::std::__cxx11::string::string(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  App::group(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e9080);
  if ((!bVar1) &&
     (pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe90), *pvVar2 != '+')) {
    return;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,__a);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,__a);
  App::set_help_flag((App *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  ::std::allocator<char>::~allocator(local_e1);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  ::std::allocator<char>::~allocator(local_b9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,__a);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffecf;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,__a);
  App::set_help_all_flag
            ((App *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator(local_109);
  return;
}

Assistant:

Option_group(std::string group_description, std::string group_name, App *parent)
        : App(std::move(group_description), "", parent) {
        group(group_name);
        // option groups should have automatic fallthrough
        if(group_name.empty() || group_name.front() == '+') {
            // help will not be used by default in these contexts
            set_help_flag("");
            set_help_all_flag("");
        }
    }